

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.yy.c
# Opt level: O1

void yypop_buffer_state(yyscan_t yyscanner)

{
  YY_BUFFER_STATE b;
  long lVar1;
  long lVar2;
  undefined1 *puVar3;
  yyguts_t *yyg_1;
  yyguts_t *yyg;
  
  if ((*(long *)((long)yyscanner + 0x28) != 0) &&
     (b = *(YY_BUFFER_STATE *)
           (*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8),
     b != (YY_BUFFER_STATE)0x0)) {
    yy_delete_buffer(b,yyscanner);
    lVar1 = *(long *)((long)yyscanner + 0x18);
    *(undefined8 *)(*(long *)((long)yyscanner + 0x28) + lVar1 * 8) = 0;
    if (lVar1 != 0) {
      *(long *)((long)yyscanner + 0x18) = lVar1 + -1;
    }
    lVar1 = *(long *)((long)yyscanner + 0x28);
    if (lVar1 != 0) {
      lVar2 = *(long *)(lVar1 + *(long *)((long)yyscanner + 0x18) * 8);
      if (lVar2 != 0) {
        *(undefined4 *)((long)yyscanner + 0x34) = *(undefined4 *)(lVar2 + 0x1c);
        puVar3 = *(undefined1 **)(lVar2 + 0x10);
        *(undefined1 **)((long)yyscanner + 0x40) = puVar3;
        *(undefined1 **)((long)yyscanner + 0x80) = puVar3;
        *(undefined8 *)((long)yyscanner + 8) =
             **(undefined8 **)(lVar1 + *(long *)((long)yyscanner + 0x18) * 8);
        *(undefined1 *)((long)yyscanner + 0x30) = *puVar3;
        *(undefined4 *)((long)yyscanner + 0x50) = 1;
      }
    }
  }
  return;
}

Assistant:

void yypop_buffer_state (yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;
	if (!YY_CURRENT_BUFFER)
		return;

	yy_delete_buffer(YY_CURRENT_BUFFER , yyscanner);
	YY_CURRENT_BUFFER_LVALUE = NULL;
	if (yyg->yy_buffer_stack_top > 0)
		--yyg->yy_buffer_stack_top;

	if (YY_CURRENT_BUFFER) {
		yy_load_buffer_state( yyscanner );
		yyg->yy_did_buffer_switch_on_eof = 1;
	}
}